

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_jsr(m68k_info *info)

{
  cs_m68k *pcVar1;
  m68k_info *in_RDI;
  m68k_info *unaff_retaddr;
  cs_m68k *ext;
  undefined8 in_stack_fffffffffffffff0;
  
  pcVar1 = build_init_op(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                         (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  set_insn_group(in_RDI,M68K_GRP_JUMP);
  get_ea_mode_op(unaff_retaddr,(cs_m68k_op *)in_RDI,(uint)((ulong)pcVar1 >> 0x20),(uint)pcVar1);
  return;
}

Assistant:

static void d68000_jsr(m68k_info *info)
{
	cs_m68k* ext = build_init_op(info, M68K_INS_JSR, 1, 0);
	set_insn_group(info, M68K_GRP_JUMP);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 4);
}